

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  file_descriptor_source source;
  path p;
  path local_70;
  path local_50;
  path local_30;
  
  paVar1 = &local_50.m_pathname.field_2;
  local_50.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/my/path","");
  boost::filesystem::detail::status((detail *)&local_70,&local_50,(error_code *)0x0);
  iVar2 = 1;
  if ((uint)local_70.m_pathname._M_dataplus._M_p < 2) {
    boost::filesystem::detail::current_path(&local_30,(error_code *)0x0);
    boost::filesystem::absolute(&local_70,&local_50,&local_30);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_70.m_pathname._M_dataplus._M_p._4_4_,
                    (uint)local_70.m_pathname._M_dataplus._M_p) != &local_70.m_pathname.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_70.m_pathname._M_dataplus._M_p._4_4_,
                               (uint)local_70.m_pathname._M_dataplus._M_p),
                      local_70.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30.m_pathname._M_dataplus._M_p != &local_30.m_pathname.field_2) {
      operator_delete(local_30.m_pathname._M_dataplus._M_p,
                      local_30.m_pathname.field_2._M_allocated_capacity + 1);
    }
    boost::iostreams::file_descriptor::file_descriptor((file_descriptor *)&local_70);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_70.m_pathname._M_string_length);
    iVar2 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.m_pathname._M_dataplus._M_p,
                    local_50.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

int main(int, char**)
{
  if (false)
    return 0;

  fs::path p("/my/path");
  if (fs::exists(p))
    return 1;

  p = fs::absolute(p);

  boost::iostreams::file_descriptor_source source;
  return 0;
}